

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<float>::LoadWeightedResidual
          (TPZDohrSubstruct<float> *this,TPZFMatrix<float> *r_global)

{
  float fVar1;
  int iVar2;
  int64_t iVar3;
  pair<int,_int> *ppVar4;
  float *pfVar5;
  TPZFMatrix<float> *in_RSI;
  long in_RDI;
  float extraout_XMM0_Da;
  pair<int,_int> ind;
  int neqs;
  int i;
  int64_t in_stack_00000038;
  int64_t in_stack_00000040;
  TPZFMatrix<float> *in_stack_00000048;
  pair<int,_int> col;
  int iVar6;
  
  TPZFMatrix<float>::Resize(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  iVar3 = TPZVec<std::pair<int,_int>_>::NElements((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5b0));
  iVar2 = (int)iVar3;
  for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    ppVar4 = TPZVec<std::pair<int,_int>_>::operator[]
                       ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5b0),(long)iVar6);
    col = *ppVar4;
    pfVar5 = TPZVec<float>::operator[]((TPZVec<float> *)(in_RDI + 0x4b0),(long)col.first);
    fVar1 = *pfVar5;
    (*(in_RSI->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
              (in_RSI,(long)col.second,0);
    pfVar5 = TPZFMatrix<float>::operator()(in_RSI,CONCAT44(iVar6,iVar2),(int64_t)col);
    *pfVar5 = fVar1 * extraout_XMM0_Da;
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::LoadWeightedResidual(const TPZFMatrix<TVar> &r_global){
	int i;
	fLocalWeightedResidual.Resize(fNEquations,1);
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		fLocalWeightedResidual(ind.first,0) = fWeights[ind.first]*r_global.GetVal(ind.second,0);
	}
}